

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

int_t zLUMemXpand(int jcol,int_t next,MemType mem_type,int_t *maxlen,GlobalLU_t *Glu)

{
  int_t nzumax_00;
  int_t nzlumax_00;
  int_t iVar1;
  int_t nzlumax;
  int_t nzumax;
  int_t nzlmax;
  void *new_mem;
  GlobalLU_t *Glu_local;
  int_t *maxlen_local;
  MemType mem_type_local;
  int_t next_local;
  int jcol_local;
  
  if (mem_type == USUB) {
    _nzumax = (int_t *)zexpand(maxlen,USUB,next,1,Glu);
  }
  else {
    _nzumax = (int_t *)zexpand(maxlen,mem_type,next,0,Glu);
  }
  if (_nzumax == (int_t *)0x0) {
    iVar1 = Glu->nzlmax;
    nzumax_00 = Glu->nzumax;
    nzlumax_00 = Glu->nzlumax;
    fprintf(_stderr,"Can\'t expand MemType %d: jcol %d\n",(ulong)mem_type,(ulong)(uint)jcol);
    iVar1 = zmemory_usage(iVar1,nzumax_00,nzlumax_00,Glu->n);
    next_local = iVar1 + Glu->n;
  }
  else {
    switch(mem_type) {
    case LUSUP:
      Glu->lusup = _nzumax;
      Glu->nzlumax = *maxlen;
      break;
    case UCOL:
      Glu->ucol = _nzumax;
      Glu->nzumax = *maxlen;
      break;
    case LSUB:
      Glu->lsub = _nzumax;
      Glu->nzlmax = *maxlen;
      break;
    case USUB:
      Glu->usub = _nzumax;
      Glu->nzumax = *maxlen;
    }
    next_local = 0;
  }
  return next_local;
}

Assistant:

int_t
zLUMemXpand(int jcol,
	   int_t next,          /* number of elements currently in the factors */
	   MemType mem_type,  /* which type of memory to expand  */
	   int_t *maxlen,       /* modified - maximum length of a data structure */
	   GlobalLU_t *Glu    /* modified - global LU data structures */
	   )
{
    void   *new_mem;
    
#if ( DEBUGlevel>=1 ) 
    printf("zLUMemXpand[1]: jcol %d, next %lld, maxlen %lld, MemType %d\n",
	   jcol, (long long) next, (long long) *maxlen, mem_type);
#endif    

    if (mem_type == USUB) 
    	new_mem = zexpand(maxlen, mem_type, next, 1, Glu);
    else
	new_mem = zexpand(maxlen, mem_type, next, 0, Glu);
    
    if ( !new_mem ) {
	int_t    nzlmax  = Glu->nzlmax;
	int_t    nzumax  = Glu->nzumax;
	int_t    nzlumax = Glu->nzlumax;
    	fprintf(stderr, "Can't expand MemType %d: jcol %d\n", mem_type, jcol);
    	return (zmemory_usage(nzlmax, nzumax, nzlumax, Glu->n) + Glu->n);
    }

    switch ( mem_type ) {
      case LUSUP:
	Glu->lusup   = (void *) new_mem;
	Glu->nzlumax = *maxlen;
	break;
      case UCOL:
	Glu->ucol   = (void *) new_mem;
	Glu->nzumax = *maxlen;
	break;
      case LSUB:
	Glu->lsub   = (int_t *) new_mem;
	Glu->nzlmax = *maxlen;
	break;
      case USUB:
	Glu->usub   = (int_t *) new_mem;
	Glu->nzumax = *maxlen;
	break;
      default: break;
    }
    
    return 0;
    
}